

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter_impl.h
# Opt level: O2

void lwlog::details::formatter::format_attribute<unsigned_long>
               (string *pattern,flag_pair *flags,unsigned_long value)

{
  char *pcVar1;
  _If_sv<std::basic_string_view<char>,_size_type> _Var2;
  string str_value;
  unsigned_long *local_50;
  string local_48;
  unsigned_long local_28;
  
  local_50 = &local_28;
  local_28 = value;
  format_attribute<unsigned_long>(std::__cxx11::string&,lwlog::details::flag_pair_const&,unsigned_long)
  ::{lambda()#1}::operator()[abi_cxx11_(&local_48,&local_50);
  while( true ) {
    pcVar1 = strstr((pattern->_M_dataplus)._M_p,(flags->verbose)._M_str);
    if (pcVar1 == (char *)0x0) break;
    _Var2 = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)pattern,&flags->verbose,0);
    std::__cxx11::string::replace((ulong)pattern,_Var2,(string *)(flags->verbose)._M_len);
  }
  while( true ) {
    pcVar1 = strstr((pattern->_M_dataplus)._M_p,(flags->shortened)._M_str);
    if (pcVar1 == (char *)0x0) break;
    _Var2 = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)pattern,&flags->shortened,0);
    std::__cxx11::string::replace((ulong)pattern,_Var2,(string *)(flags->shortened)._M_len);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void formatter::format_attribute(std::string& pattern, const flag_pair& flags, T value)
	{
		const std::string str_value = [&value]() {
			if constexpr (std::is_arithmetic_v<T>)					return std::to_string(value);
			else if constexpr (std::is_same_v<T, std::string>)		return value;
			else if constexpr (std::is_same_v<T, std::string_view>)	return value.data();
			else if constexpr (std::is_same_v<T, const char*>)		return value;
			else													return "";
		}();

		const auto& [verbose, shortened] = flags;
		while (std::strstr(pattern.data(), verbose.data()))
		{
			pattern.replace(pattern.find(verbose), verbose.length(), str_value);
		}

		while (std::strstr(pattern.data(), shortened.data()))
		{
			pattern.replace(pattern.find(shortened), shortened.length(), str_value);
		}
	}